

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::SerializeToCodedStream(MessageLite *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  LogMessage *pLVar3;
  MessageLite *message;
  LogFinisher local_71;
  string local_70;
  LogMessage local_50;
  
  iVar2 = (*this->_vptr_MessageLite[8])();
  if ((char)iVar2 == '\0') {
    message = (MessageLite *)0xf4;
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0xf4);
    pLVar3 = internal::LogMessage::operator<<(&local_50,"CHECK failed: IsInitialized(): ");
    (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)"serialize",(char *)this,message);
    pLVar3 = internal::LogMessage::operator<<(pLVar3,&local_70);
    internal::LogFinisher::operator=(&local_71,pLVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    internal::LogMessage::~LogMessage(&local_50);
  }
  bVar1 = SerializePartialToCodedStream(this,output);
  return bVar1;
}

Assistant:

bool MessageLite::SerializeToCodedStream(io::CodedOutputStream* output) const {
  GOOGLE_DCHECK(IsInitialized()) << InitializationErrorMessage("serialize", *this);
  return SerializePartialToCodedStream(output);
}